

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O3

Fl_Tree_Item * __thiscall Fl_Tree::first_visible_item(Fl_Tree *this)

{
  Fl_Tree_Item *this_00;
  
  this_00 = this->_root;
  if ((this->_prefs)._showroot != '\0') goto LAB_001d8cdc;
  if (this_00 == (Fl_Tree_Item *)0x0) {
LAB_001d8ce9:
    this_00 = (Fl_Tree_Item *)0x0;
  }
  else {
    do {
      this_00 = Fl_Tree_Item::next(this_00);
LAB_001d8cdc:
      if (this_00 == (Fl_Tree_Item *)0x0) goto LAB_001d8ce9;
    } while (this_00->_visible == '\0');
  }
  return this_00;
}

Assistant:

Fl_Tree_Item* Fl_Tree::first_visible_item() {
  Fl_Tree_Item *i = showroot() ? first() : next(first());
  while ( i ) {
    if ( i->visible() ) return(i);
    i = next(i);
  }
  return(0);
}